

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

void run_named_test(TestSuite *suite,char *name,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int *p_Var1;
  char *pcVar2;
  UnitTest *pUVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t end_time_in_milliseconds;
  long lVar9;
  long lVar10;
  
  uVar5 = cgreen_time_get_current_milliseconds();
  p_Var1 = reporter->start_suite;
  pcVar2 = suite->name;
  iVar6 = count_tests(suite);
  (*p_Var1)(reporter,pcVar2,iVar6);
  if (0 < suite->size) {
    lVar9 = 0x10;
    lVar10 = 0;
    do {
      if (*(int *)((long)suite->tests + lVar9 + -0x10) != 0) {
        _Var4 = has_test(*(TestSuite **)((long)&suite->tests->type + lVar9),name);
        if (_Var4) {
          (*suite->setup)();
          run_named_test(*(TestSuite **)((long)&suite->tests->type + lVar9),name,reporter);
          (*suite->teardown)();
        }
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar10 < suite->size);
  }
  reporter->passes = 0;
  reporter->failures = 0;
  reporter->exceptions = 0;
  reporter->skips = 0;
  uVar7 = cgreen_time_get_current_milliseconds();
  iVar6 = suite->size;
  if (0 < iVar6) {
    lVar10 = 0x10;
    lVar9 = 0;
    do {
      pUVar3 = suite->tests;
      if (*(int *)((long)pUVar3 + lVar10 + -0x10) == 0) {
        iVar8 = strcmp(*(char **)((long)pUVar3 + lVar10 + -8),name);
        if (iVar8 == 0) {
          run_test_in_the_current_process
                    (suite,*(CgreenTest **)((long)&pUVar3->type + lVar10),reporter);
          iVar6 = suite->size;
        }
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar9 < iVar6);
  }
  end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
  uVar7 = cgreen_time_duration_in_milliseconds(uVar7,end_time_in_milliseconds);
  reporter->duration = uVar7;
  uVar7 = cgreen_time_get_current_milliseconds();
  uVar5 = cgreen_time_duration_in_milliseconds(uVar5,uVar7);
  reporter->total_duration = uVar5;
  send_reporter_completion_notification(reporter);
  (*reporter->finish_suite)(reporter,suite->filename,suite->line);
  return;
}

Assistant:

static void run_named_test(TestSuite *suite, const char *name, TestReporter *reporter)
{
    int i;

    uint32_t total_test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_suite)(reporter, suite->name, count_tests(suite));
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type != test_function &&
            has_test(suite->tests[i].Runnable.suite, name))
        {
            (*suite->setup)();
            run_named_test(suite->tests[i].Runnable.suite, name, reporter);
            (*suite->teardown)();
        }
    }

    // Reset counters for top-level tests
    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type == test_function)
        {
            if (strcmp(suite->tests[i].name, name) == 0)
            {
                run_test_in_the_current_process(suite, suite->tests[i].Runnable.test, reporter);
            }
        }
    }

    reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                              cgreen_time_get_current_milliseconds());
    reporter->total_duration = cgreen_time_duration_in_milliseconds(total_test_starting_milliseconds,
                                                                    cgreen_time_get_current_milliseconds());

    send_reporter_completion_notification(reporter);
    (*reporter->finish_suite)(reporter, suite->filename, suite->line);
}